

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool QObject::disconnectImpl
               (QObject *sender,void **signal,QObject *receiver,void **slot,
               QMetaObject *senderMetaObject)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  long in_FS_OFFSET;
  int signal_index;
  QMessageLogger local_68;
  int *local_48;
  void **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) || (slot != (void **)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_68.context.version = 2;
      local_68.context._4_8_ = 0;
      local_68.context._12_8_ = 0;
      local_68.context.function._4_4_ = 0;
      local_68.context.category = lcConnect::category.name;
      bVar1 = false;
      QMessageLogger::warning(&local_68,"QObject::disconnect: Unexpected nullptr parameter");
      goto LAB_0028fd12;
    }
LAB_0028fc7e:
    bVar1 = false;
  }
  else {
    signal_index = -1;
    if (signal != (void **)0x0) {
      local_48 = &signal_index;
      local_40 = signal;
      while ((senderMetaObject != (QMetaObject *)0x0 && (signal_index < 0))) {
        QMetaObject::static_metacall(senderMetaObject,IndexOfMethod,0,&local_48);
        if ((-1 < signal_index) && (signal_index < (int)(senderMetaObject->d).data[0xd]))
        goto LAB_0028fce0;
        senderMetaObject = (senderMetaObject->d).superdata.direct;
      }
      if (senderMetaObject == (QMetaObject *)0x0) {
        lcConnect();
        if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
        {
          local_68.context.version = 2;
          local_68.context.function._4_4_ = 0;
          local_68.context._4_8_ = 0;
          local_68.context._12_8_ = 0;
          local_68.context.category = lcConnect::category.name;
          iVar2 = (**sender->_vptr_QObject)(sender);
          pcVar3 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar2));
          QMessageLogger::warning(&local_68,"QObject::disconnect: signal not found in %s",pcVar3);
        }
        goto LAB_0028fc7e;
      }
LAB_0028fce0:
      iVar2 = QMetaObjectPrivate::signalOffset(senderMetaObject);
      signal_index = iVar2 + signal_index;
    }
    bVar1 = QMetaObjectPrivate::disconnect
                      (sender,signal_index,senderMetaObject,receiver,-1,slot,DisconnectAll);
  }
LAB_0028fd12:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QObject::disconnectImpl(const QObject *sender, void **signal, const QObject *receiver, void **slot, const QMetaObject *senderMetaObject)
{
    if (sender == nullptr || (receiver == nullptr && slot != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    int signal_index = -1;
    if (signal) {
        void *args[] = { &signal_index, signal };
        for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
            senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
            if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
                break;
        }
        if (!senderMetaObject) {
            qCWarning(lcConnect, "QObject::disconnect: signal not found in %s", sender->metaObject()->className());
            return false;
        }
        signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    }

    return QMetaObjectPrivate::disconnect(sender, signal_index, senderMetaObject, receiver, -1, slot);
}